

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O1

void dump_sequence_fasta(unsigned_long index,FILE *output,long firstSequenceLength,double *d,
                        bool is_prot,unsigned_long from,unsigned_long to)

{
  long lVar1;
  char *pcVar2;
  
  pcVar2 = names.sData;
  if (d == (double *)0x0) {
    if (index < nameLengths.vLength - 1) {
      lVar1 = Vector::value(&nameLengths,index);
      pcVar2 = pcVar2 + lVar1;
    }
    else {
      pcVar2 = empty_string;
    }
    fprintf((FILE *)output,">%s\n",pcVar2);
  }
  else {
    if (index < nameLengths.vLength - 1) {
      lVar1 = Vector::value(&nameLengths,index);
      pcVar2 = pcVar2 + lVar1;
    }
    else {
      pcVar2 = empty_string;
    }
    fprintf((FILE *)output,">%s [%g, %g]\n",*d,d[1],pcVar2);
  }
  pcVar2 = sequences.sData;
  if (index < seqLengths.vLength - 1) {
    lVar1 = Vector::value(&seqLengths,index);
    pcVar2 = pcVar2 + lVar1;
  }
  else {
    pcVar2 = empty_string;
  }
  dump_fasta(pcVar2,firstSequenceLength,output,true,is_prot,from,to);
  return;
}

Assistant:

void dump_sequence_fasta (unsigned long index, FILE* output, long firstSequenceLength, double * d, bool is_prot, unsigned long from, unsigned long to) {
  if (d) {
    fprintf (output, ">%s [%g, %g]\n", stringText (names, nameLengths, index), d[0], d[1]);
  } else {
    fprintf (output, ">%s\n", stringText (names, nameLengths, index));
  }
  
  dump_fasta (stringText (sequences, seqLengths, index), firstSequenceLength, output, true, is_prot, from, to);
}